

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y)

{
  uint *puVar1;
  pointer pnVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x0;
  lVar13 = (long)(x->super_IdxSet).num;
  lVar12 = (long)(y->super_IdxSet).num;
  if (0 < lVar12 && 0 < lVar13) {
    lVar13 = lVar13 + -1;
    lVar12 = lVar12 + -1;
    piVar4 = (x->super_IdxSet).idx;
    piVar3 = (y->super_IdxSet).idx;
    iVar14 = 0;
    uVar8 = 0;
    piVar6 = piVar4;
    piVar9 = piVar3;
LAB_0028cda0:
    iVar5 = *piVar6;
    do {
      iVar11 = *piVar9;
      uVar8 = (ulong)(int)uVar8;
      while( true ) {
        lVar10 = (long)iVar14;
        if (((int)lVar13 <= (int)uVar8) || ((int)lVar12 <= iVar14)) goto LAB_0028cf46;
        if (iVar5 == iVar11) {
          lVar10 = (long)iVar5;
          pnVar2 = (x->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar15 = lVar10 * 0x38;
          local_a8.data._M_elems._32_8_ =
               *(undefined8 *)((long)&pnVar2[lVar10].m_backend.data + 0x20);
          local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[lVar10].m_backend.data;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[lVar10].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar2[lVar10].m_backend.data + 0x10);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_a8.exp = pnVar2[lVar10].m_backend.exp;
          local_a8.neg = pnVar2[lVar10].m_backend.neg;
          local_a8.fpclass = pnVar2[lVar10].m_backend.fpclass;
          local_a8.prec_elem = pnVar2[lVar10].m_backend.prec_elem;
          pnVar2 = (y->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_68.data._M_elems._32_8_ =
               *(undefined8 *)((long)&pnVar2[lVar10].m_backend.data + 0x20);
          local_68.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[lVar10].m_backend.data;
          local_68.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[lVar10].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar2[lVar10].m_backend.data + 0x10);
          local_68.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_68.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_68.exp = pnVar2[lVar10].m_backend.exp;
          local_68.neg = pnVar2[lVar10].m_backend.neg;
          local_68.fpclass = pnVar2[lVar10].m_backend.fpclass;
          local_68.prec_elem = pnVar2[lVar10].m_backend.prec_elem;
          local_e8.fpclass = cpp_dec_float_finite;
          local_e8.prec_elem = 10;
          local_e8.data._M_elems[0] = 0;
          local_e8.data._M_elems[1] = 0;
          local_e8.data._M_elems[2] = 0;
          local_e8.data._M_elems[3] = 0;
          local_e8.data._M_elems[4] = 0;
          local_e8.data._M_elems[5] = 0;
          local_e8.data._M_elems._24_5_ = 0;
          local_e8.data._M_elems[7]._1_3_ = 0;
          local_e8.data._M_elems._32_5_ = 0;
          local_e8.data._M_elems[9]._1_3_ = 0;
          local_e8.exp = 0;
          local_e8.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_e8,&local_a8,&local_68);
          lVar10 = *(long *)(this + 0x20);
          *(ulong *)(lVar10 + 0x20 + lVar15) =
               CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
          puVar1 = (uint *)(lVar10 + 0x10 + lVar15);
          *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
          *(undefined8 *)(lVar10 + lVar15) = local_e8.data._M_elems._0_8_;
          *(undefined8 *)((uint *)(lVar10 + lVar15) + 2) = local_e8.data._M_elems._8_8_;
          *(int *)(lVar10 + 0x28 + lVar15) = local_e8.exp;
          *(bool *)(lVar10 + 0x2c + lVar15) = local_e8.neg;
          *(undefined8 *)(lVar10 + 0x30 + lVar15) = local_e8._48_8_;
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
          piVar4 = (x->super_IdxSet).idx;
          piVar6 = piVar4 + (int)uVar7;
          piVar3 = (y->super_IdxSet).idx;
          lVar10 = (long)iVar14;
          iVar14 = iVar14 + 1;
          piVar9 = piVar3 + lVar10 + 1;
          goto LAB_0028cda0;
        }
        if (iVar11 <= iVar5) break;
        uVar8 = uVar8 + 1;
        iVar5 = piVar4[(int)uVar8];
      }
      lVar10 = (long)iVar14;
      iVar14 = iVar14 + 1;
      piVar9 = piVar3 + lVar10 + 1;
    } while( true );
  }
LAB_0028d059:
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
LAB_0028cf46:
  while (((long)uVar8 < lVar13 && (iVar5 != iVar11))) {
    lVar15 = uVar8 + 1;
    uVar8 = uVar8 + 1;
    iVar5 = piVar4[lVar15];
  }
  while ((lVar10 < lVar12 && (iVar5 != iVar11))) {
    lVar13 = lVar10 + 1;
    lVar10 = lVar10 + 1;
    iVar11 = piVar3[lVar13];
  }
  if (iVar5 == iVar11) {
    lVar12 = (long)iVar5;
    pnVar2 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = lVar12 * 0x38;
    local_a8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar2[lVar12].m_backend.data + 0x20);
    local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[lVar12].m_backend.data;
    local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[lVar12].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar2[lVar12].m_backend.data + 0x10);
    local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_a8.exp = pnVar2[lVar12].m_backend.exp;
    local_a8.neg = pnVar2[lVar12].m_backend.neg;
    local_a8.fpclass = pnVar2[lVar12].m_backend.fpclass;
    local_a8.prec_elem = pnVar2[lVar12].m_backend.prec_elem;
    pnVar2 = (y->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_68.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar2[lVar12].m_backend.data + 0x20);
    local_68.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[lVar12].m_backend.data;
    local_68.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[lVar12].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar2[lVar12].m_backend.data + 0x10);
    local_68.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_68.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_68.exp = pnVar2[lVar12].m_backend.exp;
    local_68.neg = pnVar2[lVar12].m_backend.neg;
    local_68.fpclass = pnVar2[lVar12].m_backend.fpclass;
    local_68.prec_elem = pnVar2[lVar12].m_backend.prec_elem;
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems._24_5_ = 0;
    local_e8.data._M_elems[7]._1_3_ = 0;
    local_e8.data._M_elems._32_5_ = 0;
    local_e8.data._M_elems[9]._1_3_ = 0;
    local_e8.exp = 0;
    local_e8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_e8,&local_a8,&local_68);
    lVar12 = *(long *)(this + 0x20);
    *(ulong *)(lVar12 + 0x20 + lVar13) =
         CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
    puVar1 = (uint *)(lVar12 + 0x10 + lVar13);
    *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
    *(ulong *)(puVar1 + 2) = CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_)
    ;
    *(undefined8 *)(lVar12 + lVar13) = local_e8.data._M_elems._0_8_;
    *(undefined8 *)((uint *)(lVar12 + lVar13) + 2) = local_e8.data._M_elems._8_8_;
    *(int *)(lVar12 + 0x28 + lVar13) = local_e8.exp;
    *(bool *)(lVar12 + 0x2c + lVar13) = local_e8.neg;
    *(undefined8 *)(lVar12 + 0x30 + lVar13) = local_e8._48_8_;
  }
  goto LAB_0028d059;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assignPWproduct4setup(const SSVectorBase<S>& x,
      const SSVectorBase<T>& y)
{
   assert(dim() == x.dim());
   assert(x.dim() == y.dim());
   assert(x.isSetup());
   assert(y.isSetup());

   clear();
   setupStatus = false;

   int i = 0;
   int j = 0;
   int n = x.size() - 1;
   int m = y.size() - 1;

   /* both x and y non-zero vectors? */
   if(m >= 0 && n >= 0)
   {
      int xi = x.index(i);
      int yj = y.index(j);

      while(i < n && j < m)
      {
         if(xi == yj)
         {
            VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
            xi = x.index(++i);
            yj = y.index(++j);
         }
         else if(xi < yj)
            xi = x.index(++i);
         else
            yj = y.index(++j);
      }

      /* check (possible) remaining indices */

      while(i < n && xi != yj)
         xi = x.index(++i);

      while(j < m && xi != yj)
         yj = y.index(++j);

      if(xi == yj)
         VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
   }

   setup();

   assert(isConsistent());

   return *this;
}